

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  char *filename_00;
  Section *__lhs;
  pointer pbVar1;
  pointer pfVar2;
  bool bVar3;
  int merge_output;
  uint uVar4;
  FILE *__s;
  FILE *__stream;
  size_type sVar5;
  _Elt_pointer ppSVar6;
  undefined8 extraout_RAX;
  long lVar7;
  char *__filename;
  pointer pbVar8;
  char *__filename_00;
  _Map_pointer local_c0;
  _Elt_pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  deque<Section_*,_std::allocator<Section_*>_> dnet;
  
  if (((uint)argc < 7) && ((0x68U >> (argc & 0x1fU) & 1) != 0)) {
    filename = argv[1];
    filename_00 = argv[2];
    merge_output = 1;
    if ((uint)argc < 5) {
      __filename_00 = "ncnn.param";
      __filename = "ncnn.bin";
    }
    else {
      __filename_00 = argv[3];
      __filename = argv[4];
      if (argc != 5) {
        merge_output = atoi(argv[5]);
      }
    }
    std::_Deque_base<Section_*,_std::allocator<Section_*>_>::_Deque_base
              (&dnet.super__Deque_base<Section_*,_std::allocator<Section_*>_>);
    puts("Loading cfg...");
    load_cfg(filename,(deque<Section_*,_std::allocator<Section_*>_> *)
                      &dnet.super__Deque_base<Section_*,_std::allocator<Section_*>_>);
    parse_cfg(&dnet,merge_output);
    puts("Loading weights...");
    load_weights(filename_00,&dnet);
    __s = fopen(__filename_00,"wb");
    if (__s == (FILE *)0x0) {
      file_error(__filename_00);
    }
    else {
      __stream = fopen(__filename,"wb");
      if (__stream != (FILE *)0x0) {
        puts("Converting model...");
        fwrite("7767517\n",8,1,__s);
        sVar5 = std::deque<Section_*,_std::allocator<Section_*>_>::size(&dnet);
        uVar4 = count_output_blob(&dnet);
        fprintf(__s,"%d %d\n",sVar5 & 0xffffffff,(ulong)uVar4);
        local_b8 = dnet.super__Deque_base<Section_*,_std::allocator<Section_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last;
        local_c0 = dnet.super__Deque_base<Section_*,_std::allocator<Section_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_node;
        ppSVar6 = dnet.super__Deque_base<Section_*,_std::allocator<Section_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur;
        while (ppSVar6 !=
               dnet.super__Deque_base<Section_*,_std::allocator<Section_*>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur) {
          __lhs = *ppSVar6;
          fprintf(__s,"%-22s %-20s %d %d",(__lhs->layer_type)._M_dataplus._M_p,
                  (__lhs->layer_name)._M_dataplus._M_p,
                  (ulong)((long)(__lhs->input_blobs).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__lhs->input_blobs).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5,
                  (ulong)((long)(__lhs->output_blobs).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(__lhs->output_blobs).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
          pbVar1 = (__lhs->input_blobs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar8 = (__lhs->input_blobs).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
              pbVar8 = pbVar8 + 1) {
            std::__cxx11::string::string((string *)&b,(string *)pbVar8);
            fprintf(__s," %s",b._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&b);
          }
          pbVar1 = (__lhs->output_blobs).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar8 = (__lhs->output_blobs).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
              pbVar8 = pbVar8 + 1) {
            std::__cxx11::string::string((string *)&b,(string *)pbVar8);
            fprintf(__s," %s",b._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&b);
          }
          pbVar1 = (__lhs->param).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar8 = (__lhs->param).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar1;
              pbVar8 = pbVar8 + 1) {
            std::__cxx11::string::string((string *)&b,(string *)pbVar8);
            fprintf(__s," %s",b._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&b);
          }
          fputc(10,__s);
          bVar3 = std::operator==(&__lhs->name,"convolutional");
          if (bVar3) {
            fseek(__stream,4,1);
            pfVar2 = (__lhs->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar7 = (long)(__lhs->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)pfVar2;
            if (lVar7 != 0) {
              fwrite(pfVar2,4,lVar7 >> 2,__stream);
            }
            pfVar2 = (__lhs->scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar7 = (long)(__lhs->scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pfVar2;
            if (lVar7 != 0) {
              fwrite(pfVar2,4,lVar7 >> 2,__stream);
            }
            pfVar2 = (__lhs->rolling_mean).super__Vector_base<float,_std::allocator<float>_>._M_impl
                     .super__Vector_impl_data._M_start;
            lVar7 = (long)(__lhs->rolling_mean).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pfVar2;
            if (lVar7 != 0) {
              fwrite(pfVar2,4,lVar7 >> 2,__stream);
            }
            pfVar2 = (__lhs->rolling_variance).super__Vector_base<float,_std::allocator<float>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar7 = (long)(__lhs->rolling_variance).
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pfVar2;
            if (lVar7 != 0) {
              fwrite(pfVar2,4,lVar7 >> 2,__stream);
            }
            pfVar2 = (__lhs->bias).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar7 = (long)(__lhs->bias).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pfVar2;
            if (lVar7 != 0) {
              fwrite(pfVar2,4,lVar7 >> 2,__stream);
            }
          }
          ppSVar6 = ppSVar6 + 1;
          if (ppSVar6 == local_b8) {
            ppSVar6 = local_c0[1];
            local_c0 = local_c0 + 1;
            local_b8 = ppSVar6 + 0x40;
          }
        }
        fclose(__s);
        sVar5 = std::deque<Section_*,_std::allocator<Section_*>_>::size(&dnet);
        uVar4 = count_output_blob(&dnet);
        printf("%d layers, %d blobs generated.\n",sVar5 & 0xffffffff,(ulong)uVar4);
        puts("NOTE: The input of darknet uses: mean_vals=0 and norm_vals=1/255.f.");
        if (merge_output == 0) {
          printf("NOTE: There are %d unmerged yolo output layer. Make sure all outputs are processed with nms.\n"
                 ,(ulong)(uint)yolo_layer_count);
        }
        if (letter_box_enabled == true) {
          puts("NOTE: Make sure your pre-processing and post-processing support letter_box.");
        }
        puts("NOTE: Remember to use ncnnoptimize for better performance.");
        std::_Deque_base<Section_*,_std::allocator<Section_*>_>::~_Deque_base
                  (&dnet.super__Deque_base<Section_*,_std::allocator<Section_*>_>);
        return 0;
      }
    }
    file_error(__filename);
    std::_Deque_base<Section_*,_std::allocator<Section_*>_>::~_Deque_base
              (&dnet.super__Deque_base<Section_*,_std::allocator<Section_*>_>);
    _Unwind_Resume(extraout_RAX);
  }
  fprintf(_stderr,
          "Usage: %s [darknetcfg] [darknetweights] [ncnnparam] [ncnnbin] [merge_output]\n\t[darknetcfg]     .cfg file of input darknet model.\n\t[darknetweights] .weights file of input darknet model.\n\t[cnnparam]       .param file of output ncnn model.\n\t[ncnnbin]        .bin file of output ncnn model.\n\t[merge_output]   merge all output yolo layers into one, enabled by default.\n"
          ,*argv);
  return -1;
}

Assistant:

int main(int argc, char** argv)
{
    if (!(argc == 3 || argc == 5 || argc == 6))
    {
        fprintf(stderr, "Usage: %s [darknetcfg] [darknetweights] [ncnnparam] [ncnnbin] [merge_output]\n"
                "\t[darknetcfg]     .cfg file of input darknet model.\n"
                "\t[darknetweights] .weights file of input darknet model.\n"
                "\t[cnnparam]       .param file of output ncnn model.\n"
                "\t[ncnnbin]        .bin file of output ncnn model.\n"
                "\t[merge_output]   merge all output yolo layers into one, enabled by default.\n",
                argv[0]);
        return -1;
    }

    const char* darknetcfg = argv[1];
    const char* darknetweights = argv[2];
    const char* ncnn_param = argc >= 5 ? argv[3] : "ncnn.param";
    const char* ncnn_bin = argc >= 5 ? argv[4] : "ncnn.bin";
    int merge_output = argc >= 6 ? atoi(argv[5]) : 1;

    std::deque<Section*> dnet;

    printf("Loading cfg...\n");
    load_cfg(darknetcfg, dnet);
    parse_cfg(dnet, merge_output);

    printf("Loading weights...\n");
    load_weights(darknetweights, dnet);

    FILE* pp = fopen(ncnn_param, "wb");
    if (pp == NULL)
        file_error(ncnn_param);

    FILE* bp = fopen(ncnn_bin, "wb");
    if (bp == NULL)
        file_error(ncnn_bin);

    printf("Converting model...\n");

    fprintf(pp, "7767517\n");
    fprintf(pp, "%d %d\n", (int)dnet.size(), count_output_blob(dnet));

    for (auto s : dnet)
    {
        fprintf(pp, "%-22s %-20s %d %d", s->layer_type.c_str(), s->layer_name.c_str(), (int)s->input_blobs.size(), (int)s->output_blobs.size());
        for (auto b : s->input_blobs)
            fprintf(pp, " %s", b.c_str());
        for (auto b : s->output_blobs)
            fprintf(pp, " %s", b.c_str());
        for (auto p : s->param)
            fprintf(pp, " %s", p.c_str());
        fprintf(pp, "\n");

        if (s->name == "convolutional")
        {
            fseek(bp, 4, SEEK_CUR);
            if (s->weights.size() > 0)
                fwrite(&s->weights[0], sizeof(float), s->weights.size(), bp);
            if (s->scales.size() > 0)
                fwrite(&s->scales[0], sizeof(float), s->scales.size(), bp);
            if (s->rolling_mean.size() > 0)
                fwrite(&s->rolling_mean[0], sizeof(float), s->rolling_mean.size(), bp);
            if (s->rolling_variance.size() > 0)
                fwrite(&s->rolling_variance[0], sizeof(float), s->rolling_variance.size(), bp);
            if (s->bias.size() > 0)
                fwrite(&s->bias[0], sizeof(float), s->bias.size(), bp);
        }
    }
    fclose(pp);

    printf("%d layers, %d blobs generated.\n", (int)dnet.size(), count_output_blob(dnet));
    printf("NOTE: The input of darknet uses: mean_vals=0 and norm_vals=1/255.f.\n");
    if (!merge_output)
        printf("NOTE: There are %d unmerged yolo output layer. Make sure all outputs are processed with nms.\n", yolo_layer_count);
    if (letter_box_enabled)
        printf("NOTE: Make sure your pre-processing and post-processing support letter_box.\n");
    printf("NOTE: Remember to use ncnnoptimize for better performance.\n");

    return 0;
}